

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O1

void do_jobs(pmtr_t *cfg)

{
  UT_array *pUVar1;
  job_t *pjVar2;
  char *pcVar3;
  __rlimit_resource_t *p_Var4;
  char **__argv;
  __pid_t _Var5;
  int iVar6;
  int iVar7;
  time_t tVar8;
  ulong uVar9;
  passwd *ppVar10;
  char *pcVar11;
  __rlimit_resource_t *p_Var12;
  job_t *job;
  long lVar13;
  bool bVar14;
  int es;
  time_t now;
  rlimit new_limit;
  sigset_t none;
  uint local_ec;
  char *local_e8;
  char *local_e0;
  time_t local_d8;
  char *local_d0;
  char *local_c8;
  rlimit local_c0;
  sigset_t local_b0;
  
  job = (job_t *)0x0;
LAB_00105655:
  if (job == (job_t *)0x0) {
    if (cfg->jobs->i == 0) goto LAB_0010569a;
    job = (job_t *)cfg->jobs->d;
  }
  else {
    pUVar1 = cfg->jobs;
    pjVar2 = (job_t *)pUVar1->d;
    if (job < pjVar2) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)((long)job - (long)pjVar2) / (pUVar1->icd).sz + 1;
    }
    if (uVar9 < pUVar1->i) {
      uVar9 = (pUVar1->icd).sz;
      if (job < pjVar2) {
        lVar13 = 0;
      }
      else {
        lVar13 = (ulong)((long)job - (long)pjVar2) / uVar9 + 1;
      }
      job = (job_t *)((long)&pjVar2->name + lVar13 * uVar9);
    }
    else {
LAB_0010569a:
      job = (job_t *)0x0;
    }
  }
  if (job == (job_t *)0x0) {
    return;
  }
  if ((((job->bounce_interval != 0) && (job->pid != 0)) &&
      (local_d8 = time((time_t *)0x0), (long)job->bounce_interval <= local_d8 - job->start_ts)) &&
     (job->terminate == 0)) {
    job->terminate = 1;
  }
  if (job->terminate != 0) {
    signal_job(job);
    goto LAB_00105655;
  }
  if (((job->disabled != 0) || (job->pid != 0)) || (job->respawn == 0)) goto LAB_00105655;
  lVar13 = job->start_at;
  tVar8 = time(&local_d8);
  if (tVar8 < lVar13) {
    alarm_within(cfg,(int)job->start_at - (int)local_d8);
    goto LAB_00105655;
  }
  _Var5 = fork();
  if (_Var5 == -1) {
    syslog(3,"fork error\n");
    _Var5 = getpid();
    kill(_Var5,0xf);
    return;
  }
  if (0 < _Var5) {
    job->pid = _Var5;
    tVar8 = time((time_t *)0x0);
    job->start_ts = tVar8;
    syslog(6,"started job %s [%d]",job->name,(ulong)(uint)job->pid);
    if (job->wait != 0) {
      syslog(6,"pausing for job %s to finish",job->name);
      _Var5 = waitpid(job->pid,(int *)&local_ec,0);
      if (_Var5 == job->pid) {
        syslog(6,"job %s finished",job->name);
        if (((local_ec & 0xff7f) == 0x2100) || (job->once != 0)) {
          job->respawn = 0;
        }
        job->pid = 0;
      }
      else {
        syslog(3,"waitpid for job %s failed\n",job->name);
      }
    }
    goto LAB_00105655;
  }
  if (_Var5 != 0) {
    __assert_fail("pid == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/job.c",
                  0x25a,"void do_jobs(pmtr_t *)");
  }
  if ((job->dir == (char *)0x0) || (iVar6 = chdir(job->dir), iVar6 != -1)) {
    closelog();
    pcVar11 = (char *)0x0;
    do {
      if (pcVar11 == (char *)0x0) {
        if ((job->envv).i == 0) goto LAB_00105909;
        pcVar11 = (job->envv).d;
      }
      else {
        pcVar3 = (job->envv).d;
        if (pcVar11 < pcVar3) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)((long)pcVar11 - (long)pcVar3) / (job->envv).icd.sz + 1;
        }
        if (uVar9 < (job->envv).i) {
          uVar9 = (job->envv).icd.sz;
          if (pcVar11 < pcVar3) {
            lVar13 = 0;
          }
          else {
            lVar13 = (ulong)((long)pcVar11 - (long)pcVar3) / uVar9 + 1;
          }
          pcVar11 = pcVar3 + lVar13 * uVar9;
        }
        else {
LAB_00105909:
          pcVar11 = (char *)0x0;
        }
      }
      if (pcVar11 == (char *)0x0) goto LAB_00105932;
      putenv(*(char **)pcVar11);
    } while( true );
  }
  iVar6 = -1;
  goto LAB_00105aa1;
LAB_00105932:
  iVar6 = setpriority(PRIO_PROCESS,0,job->nice);
  if (iVar6 < 0) {
    iVar6 = -5;
  }
  else {
    iVar6 = __sched_cpucount(0x80,(cpu_set_t *)&job->cpuset);
    if ((iVar6 < 1) || (iVar6 = sched_setaffinity(0,0x80,(cpu_set_t *)&job->cpuset), iVar6 == 0)) {
      p_Var12 = (__rlimit_resource_t *)0x0;
      do {
        if (p_Var12 == (__rlimit_resource_t *)0x0) {
          if ((job->rlim).i == 0) goto LAB_001059e3;
          p_Var12 = (__rlimit_resource_t *)(job->rlim).d;
        }
        else {
          p_Var4 = (__rlimit_resource_t *)(job->rlim).d;
          if (p_Var12 < p_Var4) {
            uVar9 = 0;
          }
          else {
            uVar9 = (ulong)((long)p_Var12 - (long)p_Var4) / (job->rlim).icd.sz + 1;
          }
          if (uVar9 < (job->rlim).i) {
            uVar9 = (job->rlim).icd.sz;
            if (p_Var12 < p_Var4) {
              lVar13 = 0;
            }
            else {
              lVar13 = (ulong)((long)p_Var12 - (long)p_Var4) / uVar9 + 1;
            }
            p_Var12 = (__rlimit_resource_t *)((long)p_Var4 + lVar13 * uVar9);
          }
          else {
LAB_001059e3:
            p_Var12 = (__rlimit_resource_t *)0x0;
          }
        }
        if (p_Var12 == (__rlimit_resource_t *)0x0) {
          lVar13 = 0;
          do {
            signal(*(int *)((long)sigs + lVar13),(__sighandler_t)0x0);
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x20);
          sigemptyset(&local_b0);
          sigprocmask(2,&local_b0,(sigset_t *)0x0);
          if (job->user[0] != '\0') {
            ppVar10 = getpwnam(job->user);
            if (ppVar10 == (passwd *)0x0) {
              iVar6 = -7;
LAB_00105db6:
              bVar14 = false;
            }
            else {
              iVar6 = setgid(ppVar10->pw_gid);
              if (iVar6 == -1) {
                iVar6 = -8;
                goto LAB_00105db6;
              }
              iVar6 = initgroups(job->user,ppVar10->pw_gid);
              if (iVar6 == -1) {
                iVar6 = -9;
                goto LAB_00105db6;
              }
              iVar6 = setuid(ppVar10->pw_uid);
              bVar14 = iVar6 != -1;
              iVar6 = -10;
              if (bVar14) {
                iVar6 = -1;
              }
            }
            if (!bVar14) goto LAB_00105aa1;
          }
          local_d0 = "/dev/null";
          if (job->in != (char *)0x0) {
            local_d0 = job->in;
          }
          local_e0 = job->out;
          if (local_e0 == (char *)0x0) {
            local_e0 = "syslog";
          }
          local_e8 = job->err;
          if (local_e8 == (char *)0x0) {
            local_e8 = "syslog";
          }
          iVar6 = redirect(cfg,0,local_d0,0,0);
          if (iVar6 < 0) {
            iVar6 = -2;
          }
          else {
            iVar6 = redirect(cfg,1,local_e0,0x441,0x1a4);
            if (iVar6 < 0) {
              iVar6 = -3;
            }
            else {
              iVar6 = redirect(cfg,2,local_e8,0x441,0x1a4);
              if (iVar6 < 0) {
                iVar6 = -4;
              }
              else {
                __argv = (char **)(job->cmdv).d;
                local_c8 = *__argv;
                iVar7 = execv(local_c8,__argv);
                iVar6 = -0xb;
                if (iVar7 != -1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/job.c"
                                ,0x294,"void do_jobs(pmtr_t *)");
                }
              }
            }
          }
          goto LAB_00105aa1;
        }
        local_c0.rlim_cur = *(rlim_t *)(p_Var12 + 2);
        local_c0.rlim_max = *(rlim_t *)(p_Var12 + 4);
        iVar6 = setrlimit(*p_Var12,&local_c0);
      } while (iVar6 == 0);
      iVar6 = -6;
    }
    else {
      iVar6 = -0xc;
    }
  }
LAB_00105aa1:
  (*(code *)((long)&DAT_0010a004 + (long)(int)(&DAT_0010a004)[iVar6 + 0xc]))();
  return;
}

Assistant:

void do_jobs(pmtr_t *cfg) {
  pid_t pid;
  time_t now, elapsed;
  int es, n, fo, fe, fi, rc=-1, ds;
  char *pathname, *o, *e, *i, **argv, **env;

  job_t *job = NULL;
  while ( (job = (job_t*)utarray_next(cfg->jobs,job))) {
    if (job->bounce_interval && job->pid) { 
      now = time(NULL);
      elapsed = now - job->start_ts;
      if (elapsed >= job->bounce_interval) {
        if (job->terminate==0) job->terminate=1;
      }
    }
    if (job->terminate) {signal_job(job); continue;}
    if (job->disabled) continue;
    if (job->pid) continue;  /* running already */
    if (job->respawn == 0) continue;  /* don't respawn */
    if (job->start_at > time(&now)) {  /* not yet */
      alarm_within(cfg, job->start_at - now);
      continue;
    }

    pid = fork();

    if (pid == -1) {
      syslog(LOG_ERR,"fork error\n");
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      return;
    }

    if (pid > 0) {  /* parent */
      job->pid = pid;
      job->start_ts = time(NULL);
      syslog(LOG_INFO,"started job %s [%d]", job->name, (int)job->pid);
      /* support the 'wait' feature which pauses (blocks) for a job to finish.*/
      if (job->wait) {
        syslog(LOG_INFO,"pausing for job %s to finish",job->name);
        if (waitpid(job->pid, &es, 0) != job->pid) {
          syslog(LOG_ERR,"waitpid for job %s failed\n",job->name);
          continue;
        }
        syslog(LOG_INFO,"job %s finished",job->name);
        if (WIFEXITED(es) && (WEXITSTATUS(es) == PMTR_NO_RESTART)) job->respawn=0;
        else if (job->once) job->respawn=0;
        job->pid = 0;
      }
      continue;
    }

    /*********************************************************************
     * child here 
     ********************************************************************/
    assert(pid == 0);

    /* setup working dir */
    if (job->dir && (chdir(job->dir) == -1))                 {rc=-1; goto fail;}

    /* close inherited descriptors */
    closelog(); 

    /* set environment variables */
    env=NULL;
    while ( (env=(char**)utarray_next(&job->envv,env))) putenv(*env);

    /* set process priority / nice */
    if (setpriority(PRIO_PROCESS, 0, job->nice) < 0)         {rc=-5; goto fail;}

    /* set cpu affinity, if any */
    if ((CPU_COUNT(&job->cpuset) > 0) &&
      sched_setaffinity(0, sizeof(cpu_set_t), &job->cpuset)) {rc=-12; goto fail;}

    /* set ulimits */
    resource_rlimit_t *rt=NULL;
    while ( (rt=(resource_rlimit_t*)utarray_next(&job->rlim,rt))) {
      struct rlimit new_limit = {.rlim_cur=rt->rlim.rlim_cur,
                                 .rlim_max=rt->rlim.rlim_max};
      if (setrlimit(rt->id, &new_limit))                     {rc=-6; goto fail;}
    }

    /* restore/unblock default handlers so they're unblocked after exec */
    for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) signal(sigs[n], SIG_DFL);
    sigset_t none;
    sigemptyset(&none);
    sigprocmask(SIG_SETMASK,&none,NULL);

    /* change the real and effective user ids, and set the gid and supp groups */
    if (*job->user) {
      struct passwd *p;
      if ( (p = getpwnam(job->user)) == NULL)                {rc=-7; goto fail;}
      if (setgid(p->pw_gid) == -1)                           {rc=-8; goto fail;}
      if (initgroups(job->user, p->pw_gid) == -1)            {rc=-9; goto fail;}
      if (setuid(p->pw_uid) == -1)                           {rc=-10; goto fail;}
    }

    /* redirect the child's stdout and stderr to syslog unless user specified */
    i = job->in  ? job->in  : "/dev/null";
    o = job->out ? job->out : "syslog";
    e = job->err ? job->err : "syslog";

    int flags_wr = O_WRONLY|O_CREAT|O_APPEND;
    if (redirect(cfg, STDIN_FILENO,  i, O_RDONLY, 0)    < 0) { rc=-2; goto fail;}
    if (redirect(cfg, STDOUT_FILENO, o, flags_wr, 0644) < 0) { rc=-3; goto fail;}
    if (redirect(cfg, STDERR_FILENO, e, flags_wr, 0644) < 0) { rc=-4; goto fail;}

    /* at last. we're ready to run the child process */
    argv = (char**)utarray_front(&job->cmdv);
    pathname = *argv;
    if (execv(pathname, argv) == -1)                         {rc=-11; goto fail;}

    /* not reached - child has exec'd */
    assert(0); 

   fail:
    if (rc==-1) syslog(LOG_ERR,"can't chdir %s: %s", job->dir, strerror(errno));
    if (rc==-2) syslog(LOG_ERR,"can't open/dup %s: %s", i, strerror(errno));
    if (rc==-3) syslog(LOG_ERR,"can't open/dup %s: %s", o, strerror(errno));
    if (rc==-4) syslog(LOG_ERR,"can't open/dup %s: %s", e, strerror(errno));
    if (rc==-5) syslog(LOG_ERR,"can't setpriority: %s", strerror(errno));
    if (rc==-6) syslog(LOG_ERR,"can't setrlimit: %s", strerror(errno));
    if (rc==-7) syslog(LOG_ERR,"unknown user: %s", job->user);
    if (rc==-8) syslog(LOG_ERR,"can't setgid %s: %s", job->user, strerror(errno));
    if (rc==-9) syslog(LOG_ERR,"can't initgroups %s: %s", job->user, strerror(errno));
    if (rc==-10) syslog(LOG_ERR,"can't setuid %s: %s", job->user, strerror(errno));
    if (rc==-11) syslog(LOG_ERR,"can't exec %s: %s", pathname, strerror(errno));
    if (rc==-12) syslog(LOG_ERR,"can't set cpu affinity: %s", strerror(errno));
    exit(-1);  /* child exit */
  }
}